

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O0

void __thiscall
pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
move_construct<pstore::romfs::directory_const*>
          (error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>> *this,
          error_or<const_pstore::romfs::directory_*> *rhs)

{
  error_code *peVar1;
  storage_type *this_00;
  storage_type *ppdVar2;
  error_code eVar3;
  error_or<const_pstore::romfs::directory_*> *rhs_local;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *this_local;
  
  this[0x10] = (error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>)
               (rhs->has_error_ & 1);
  if (((byte)this[0x10] & 1) == 0) {
    this_00 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_storage
                        ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)this)
    ;
    ppdVar2 = error_or<const_pstore::romfs::directory_*>::get_storage(rhs);
    pstore::gsl::not_null<const_pstore::romfs::directory_*>::not_null(this_00,*ppdVar2);
  }
  else {
    peVar1 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error_storage
                       ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)this);
    eVar3 = error_or<const_pstore::romfs::directory_*>::get_error(rhs);
    peVar1->_M_value = eVar3._M_value;
    peVar1->_M_cat = eVar3._M_cat;
  }
  return;
}

Assistant:

void error_or<T>::move_construct (error_or<Other> && rhs) noexcept {
        has_error_ = rhs.has_error_;
        if (has_error_) {
            new (get_error_storage ()) std::error_code (rhs.get_error ());
        } else {
            new (get_storage ()) storage_type (std::move (*rhs.get_storage ()));
        }
    }